

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

string * __thiscall VolumeFile::getEntryPath(VolumeFile *this,EntryKey *entryKey,string *prefix)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uchar *puVar4;
  StringKey *key;
  string *in_RCX;
  EntryKey *in_RDX;
  VolumeFile *in_RSI;
  string *in_RDI;
  StringKey extKey;
  StringBTree extBtree;
  StringKey nameKey;
  StringBTree nameBtree;
  string *path;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  StringBTree *in_stack_ffffffffffffff10;
  StringKey *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  StringKey local_68;
  StringKey local_50 [2];
  undefined1 local_21;
  EntryKey *local_18;
  
  local_21 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI,in_RCX);
  puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1339b7);
  uVar2 = nameTreeOffset(in_RSI);
  advancePointer<unsigned_char>(puVar4,(ulong)uVar2);
  StringBTree::StringBTree
            (in_stack_ffffffffffffff10,
             (uint8_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  StringKey::StringKey(local_50);
  EntryKey::nameIndex(local_18);
  bVar1 = BTree<StringBTree,_StringKey>::searchByIndex
                    ((BTree<StringBTree,_StringKey> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
  if (bVar1) {
    StringKey::value(local_50);
    StringKey::value(local_50);
    StringKey::length(local_50);
    std::__cxx11::string::append<char_const*,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
  }
  bVar1 = EntryKey::isFile(local_18);
  if (bVar1) {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133b00);
    uVar2 = extTreeOffset(in_RSI);
    key = (StringKey *)advancePointer<unsigned_char>(puVar4,(ulong)uVar2);
    StringBTree::StringBTree
              (in_stack_ffffffffffffff10,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    StringKey::StringKey(&local_68);
    EntryKey::extIndex(local_18);
    bVar1 = BTree<StringBTree,_StringKey>::searchByIndex
                      ((BTree<StringBTree,_StringKey> *)CONCAT44(uVar2,in_stack_ffffffffffffff40),
                       (uint)((ulong)puVar4 >> 0x20),key);
    if ((bVar1) && (uVar3 = StringKey::length(&local_68), uVar3 != 0)) {
      StringKey::value(&local_68);
      StringKey::value(&local_68);
      StringKey::length(&local_68);
      std::__cxx11::string::append<char_const*,void>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar2,in_stack_ffffffffffffff40),(char *)puVar4,(char *)key);
    }
  }
  else {
    bVar1 = EntryKey::isDirectory(local_18);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)in_RDI,'/');
    }
  }
  return in_RDI;
}

Assistant:

std::string VolumeFile::getEntryPath(const EntryKey& entryKey, const std::string& prefix) const
{
	std::string path(prefix);

	StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	StringKey nameKey;
	if (nameBtree.searchByIndex(entryKey.nameIndex(), nameKey)) {
		path.append(nameKey.value(), nameKey.value() + nameKey.length());
	}

	if (entryKey.isFile()) {
		StringBTree extBtree(
			advancePointer(m_data.data(), extTreeOffset())
		);
		StringKey extKey;
		if (extBtree.searchByIndex(entryKey.extIndex(), extKey)) {
			if (extKey.length() > 0) {
				path.append(extKey.value(), extKey.value() + extKey.length());
			}
		}
	} else if (entryKey.isDirectory()) {
		path += '/';
	}

	return path;
}